

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::fix_in_buffer(jpeg_decoder *this)

{
  jpeg_decoder *this_local;
  
  if ((this->m_bits_left & 7U) == 0) {
    if (this->m_bits_left == 0x10) {
      stuff_char(this,(uint8)this->m_bit_buf);
    }
    if (7 < this->m_bits_left) {
      stuff_char(this,(uint8)(this->m_bit_buf >> 8));
    }
    stuff_char(this,(uint8)(this->m_bit_buf >> 0x10));
    stuff_char(this,(uint8)(this->m_bit_buf >> 0x18));
    this->m_bits_left = 0x10;
    get_bits_no_markers(this,0x10);
    get_bits_no_markers(this,0x10);
    return;
  }
  __assert_fail("(m_bits_left & 7) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                ,0x528,"void jpgd::jpeg_decoder::fix_in_buffer()");
}

Assistant:

void jpeg_decoder::fix_in_buffer()
	{
		// In case any 0xFF's where pulled into the buffer during marker scanning.
		assert((m_bits_left & 7) == 0);

		if (m_bits_left == 16)
			stuff_char((uint8)(m_bit_buf & 0xFF));

		if (m_bits_left >= 8)
			stuff_char((uint8)((m_bit_buf >> 8) & 0xFF));

		stuff_char((uint8)((m_bit_buf >> 16) & 0xFF));
		stuff_char((uint8)((m_bit_buf >> 24) & 0xFF));

		m_bits_left = 16;
		get_bits_no_markers(16);
		get_bits_no_markers(16);
	}